

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O3

void duckdb::UnaryExecutor::
     ExecuteFlat<duckdb::string_t,unsigned_long,duckdb::UnaryLambdaWrapper,unsigned_long(*)(duckdb::string_t_const&)>
               (string_t *ldata,unsigned_long *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  unsigned_long *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  ulong uVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  TemplatedValidityData<unsigned_long> *pTVar5;
  unsigned_long uVar6;
  idx_t iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  _func_unsigned_long_string_t_ptr **fun_1;
  ulong uVar12;
  char **ppcVar13;
  _func_unsigned_long_string_t_ptr **fun;
  char **local_70;
  element_type *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_60;
  idx_t local_58;
  ValidityMask *local_50;
  ulong local_48;
  unsigned_long *local_40;
  idx_t local_38;
  
  puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  local_50 = mask;
  if (puVar1 == (unsigned_long *)0x0) {
    if (count != 0) {
      local_70 = &(ldata->value).pointer.ptr;
      iVar7 = 0;
      do {
        local_68 = *(element_type **)(local_70 + -1);
        p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*local_70;
        uVar6 = (**dataptr)(&local_68);
        result_data[iVar7] = uVar6;
        iVar7 = iVar7 + 1;
        local_70 = local_70 + 2;
      } while (count != iVar7);
    }
  }
  else {
    if (adds_nulls) {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity = count;
      local_38 = count;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                ((duckdb *)&local_68,(unsigned_long **)mask,&local_38);
      p_Var4 = p_Stack_60;
      peVar3 = local_68;
      local_68 = (element_type *)0x0;
      p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = peVar3;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var4;
      if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
         p_Stack_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_60);
      }
      pTVar5 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                         (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
           (unsigned_long *)
           (pTVar5->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>;
    }
    else {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask = puVar1;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data,
                 &(mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity =
           (mask->super_TemplatedValidityMask<unsigned_long>).capacity;
    }
    if (0x3f < count + 0x3f) {
      local_48 = count + 0x3f >> 6;
      uVar11 = 0;
      uVar12 = 0;
      local_58 = count;
      do {
        puVar1 = (local_50->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (puVar1 == (unsigned_long *)0x0) {
          uVar9 = uVar12 + 0x40;
          if (count <= uVar12 + 0x40) {
            uVar9 = count;
          }
LAB_013e1819:
          uVar10 = uVar12;
          if (uVar12 < uVar9) {
            ppcVar13 = &ldata[uVar12].value.pointer.ptr;
            do {
              local_68 = *(element_type **)(ppcVar13 + -1);
              p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*ppcVar13;
              uVar6 = (**dataptr)(&local_68);
              result_data[uVar12] = uVar6;
              uVar12 = uVar12 + 1;
              ppcVar13 = ppcVar13 + 2;
              uVar10 = uVar9;
              count = local_58;
            } while (uVar9 != uVar12);
          }
        }
        else {
          uVar2 = puVar1[uVar11];
          uVar9 = uVar12 + 0x40;
          if (count <= uVar12 + 0x40) {
            uVar9 = count;
          }
          uVar10 = uVar9;
          if (uVar2 != 0) {
            if (uVar2 == 0xffffffffffffffff) goto LAB_013e1819;
            uVar10 = uVar12;
            count = local_58;
            if (uVar12 < uVar9) {
              local_40 = result_data + uVar12;
              ppcVar13 = &ldata[uVar12].value.pointer.ptr;
              uVar8 = 0;
              do {
                if ((uVar2 >> (uVar8 & 0x3f) & 1) != 0) {
                  local_68 = *(element_type **)(ppcVar13 + -1);
                  p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*ppcVar13;
                  uVar6 = (**dataptr)(&local_68);
                  local_40[uVar8] = uVar6;
                }
                uVar8 = uVar8 + 1;
                ppcVar13 = ppcVar13 + 2;
                uVar10 = uVar9;
                count = local_58;
              } while (uVar9 - uVar12 != uVar8);
            }
          }
        }
        uVar11 = uVar11 + 1;
        uVar12 = uVar10;
      } while (uVar11 != local_48);
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}